

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall
Fl_Text_Display::wrapped_line_counter
          (Fl_Text_Display *this,Fl_Text_Buffer *buf,int startPos,int maxPos,int maxLines,
          bool startPosIsLineStart,int styleBufOffset,int *retPos,int *retLines,int *retLineStart,
          int *retLineEnd,bool countLastLineMissingNewLine)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  double dVar5;
  int local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  char *s_1;
  int iMax;
  char *s;
  int p1;
  uint c;
  int nLines;
  double width;
  int foundBreak;
  int i;
  int wrapMarginPix;
  int colNum;
  int p;
  int b;
  int newLineStart;
  int lineStart;
  bool countLastLineMissingNewLine_local;
  bool startPosIsLineStart_local;
  int maxLines_local;
  int maxPos_local;
  int startPos_local;
  Fl_Text_Buffer *buf_local;
  Fl_Text_Display *this_local;
  
  p = 0;
  p1 = 0;
  if (this->mWrapMarginPix == 0) {
    foundBreak = (this->text_area).w;
  }
  else {
    foundBreak = this->mWrapMarginPix;
  }
  b = startPos;
  if (!startPosIsLineStart) {
    b = line_start(this,startPos);
  }
  i = 0;
  _c = 0.0;
  wrapMarginPix = b;
  while( true ) {
    iVar2 = Fl_Text_Buffer::length(buf);
    if (iVar2 <= wrapMarginPix) {
      iVar2 = Fl_Text_Buffer::length(buf);
      *retPos = iVar2;
      *retLines = p1;
      if ((countLastLineMissingNewLine) && (0 < i)) {
        iVar2 = Fl_Text_Buffer::next_char(buf,*retLines);
        *retLines = iVar2;
      }
      *retLineStart = b;
      iVar2 = Fl_Text_Buffer::length(buf);
      *retLineEnd = iVar2;
      return;
    }
    uVar3 = Fl_Text_Buffer::char_at(buf,wrapMarginPix);
    if (uVar3 == 10) {
      if (maxPos <= wrapMarginPix) {
        *retPos = maxPos;
        *retLines = p1;
        *retLineStart = b;
        *retLineEnd = maxPos;
        return;
      }
      p1 = p1 + 1;
      b = Fl_Text_Buffer::next_char(buf,wrapMarginPix);
      if (maxLines <= p1) {
        *retPos = b;
        *retLines = p1;
        *retLineStart = b;
        *retLineEnd = wrapMarginPix;
        return;
      }
      i = 0;
      _c = 0.0;
    }
    else {
      pcVar4 = Fl_Text_Buffer::address(buf,wrapMarginPix);
      i = i + 1;
      dVar5 = measure_proportional_character(this,pcVar4,(int)_c,wrapMarginPix + styleBufOffset);
      _c = dVar5 + _c;
    }
    if ((double)foundBreak < _c) break;
LAB_00222a75:
    wrapMarginPix = Fl_Text_Buffer::next_char(buf,wrapMarginPix);
  }
  bVar1 = false;
  colNum = wrapMarginPix;
LAB_002227f1:
  if (b <= colNum) {
    uVar3 = Fl_Text_Buffer::char_at(buf,colNum);
    if ((uVar3 != 9) && (uVar3 != 0x20)) goto LAB_002228b2;
    p = Fl_Text_Buffer::next_char(buf,colNum);
    i = 0;
    _c = 0.0;
    iVar2 = Fl_Text_Buffer::next_char(buf,wrapMarginPix);
    for (width._4_4_ = Fl_Text_Buffer::next_char(buf,colNum); width._4_4_ < iVar2;
        width._4_4_ = Fl_Text_Buffer::next_char(buf,width._4_4_)) {
      pcVar4 = Fl_Text_Buffer::address(buf,width._4_4_);
      dVar5 = measure_proportional_character(this,pcVar4,(int)_c,width._4_4_ + styleBufOffset);
      _c = dVar5 + _c;
      i = i + 1;
    }
    bVar1 = true;
  }
  if (colNum < b) {
    colNum = b;
  }
  if (!bVar1) {
    iVar2 = Fl_Text_Buffer::next_char(buf,b);
    p = max(wrapMarginPix,iVar2);
    i = i + 1;
    iVar2 = Fl_Text_Buffer::length(buf);
    if (colNum < iVar2) {
      pcVar4 = Fl_Text_Buffer::address(buf,colNum);
      _c = measure_proportional_character(this,pcVar4,0,wrapMarginPix + styleBufOffset);
    }
    else {
      _c = 0.0;
    }
  }
  if (maxPos <= wrapMarginPix) {
    *retPos = maxPos;
    if (maxPos < p) {
      local_a0 = p1;
    }
    else {
      local_a0 = p1 + 1;
    }
    *retLines = local_a0;
    if (maxPos < p) {
      local_a4 = b;
    }
    else {
      local_a4 = p;
    }
    *retLineStart = local_a4;
    *retLineEnd = maxPos;
    return;
  }
  p1 = p1 + 1;
  if (maxLines <= p1) {
    if (bVar1) {
      local_a8 = Fl_Text_Buffer::next_char(buf,colNum);
    }
    else {
      iVar2 = Fl_Text_Buffer::next_char(buf,b);
      local_a8 = max(wrapMarginPix,iVar2);
    }
    *retPos = local_a8;
    *retLines = p1;
    *retLineStart = b;
    if (bVar1) {
      local_b0 = colNum;
    }
    else {
      local_b0 = wrapMarginPix;
    }
    *retLineEnd = local_b0;
    return;
  }
  b = p;
  goto LAB_00222a75;
LAB_002228b2:
  colNum = Fl_Text_Buffer::prev_char(buf,colNum);
  goto LAB_002227f1;
}

Assistant:

void Fl_Text_Display::wrapped_line_counter(Fl_Text_Buffer *buf, int startPos,
                                           int maxPos, int maxLines, bool startPosIsLineStart, int styleBufOffset,
                                           int *retPos, int *retLines, int *retLineStart, int *retLineEnd,
                                           bool countLastLineMissingNewLine) const {
  IS_UTF8_ALIGNED2(buf, startPos)
  IS_UTF8_ALIGNED2(buf, maxPos)

  int lineStart, newLineStart = 0, b, p, colNum, wrapMarginPix;
  int i, foundBreak;
  double width;
  int nLines = 0;
  unsigned int c;

  /* Set the wrap margin to the wrap column or the view width */
  if (mWrapMarginPix != 0) {
    wrapMarginPix = mWrapMarginPix;
  } else {
    wrapMarginPix = text_area.w;
  }

  /* Find the start of the line if the start pos is not marked as a
   line start. */
  if (startPosIsLineStart)
    lineStart = startPos;
  else
    lineStart = line_start(startPos);

  /*
   ** Loop until position exceeds maxPos or line count exceeds maxLines.
   ** (actually, continues beyond maxPos to end of line containing maxPos,
   ** in case later characters cause a word wrap back before maxPos)
   */
  colNum = 0;
  width = 0;
  for (p=lineStart; p<buf->length(); p=buf->next_char(p)) {
    c = buf->char_at(p);  // UCS-4

    /* If the character was a newline, count the line and start over,
     otherwise, add it to the width and column counts */
    if (c == '\n') {
      if (p >= maxPos) {
        *retPos = maxPos;
        *retLines = nLines;
        *retLineStart = lineStart;
        *retLineEnd = maxPos;
        return;
      }
      nLines++;
      int p1 = buf->next_char(p);
      if (nLines >= maxLines) {
        *retPos = p1;
        *retLines = nLines;
        *retLineStart = p1;
        *retLineEnd = p;
        return;
      }
      lineStart = p1;
      colNum = 0;
      width = 0;
    } else {
      const char *s = buf->address(p);
      colNum++;
      // FIXME: it is not a good idea to simply add character widths because on
      // some platforms, the width is a floating point value and depends on the
      // previous character as well.
      width += measure_proportional_character(s, (int)width, p+styleBufOffset);
    }

    /* If character exceeded wrap margin, find the break point and wrap there */
    if (width > wrapMarginPix) {
      foundBreak = false;
      for (b=p; b>=lineStart; b=buf->prev_char(b)) {
        c = buf->char_at(b);
        if (c == '\t' || c == ' ') {
          newLineStart = buf->next_char(b);
          colNum = 0;
          width = 0;
          int iMax = buf->next_char(p);
          for (i=buf->next_char(b); i<iMax; i = buf->next_char(i)) {
            width += measure_proportional_character(buf->address(i), (int)width,
                                                    i+styleBufOffset);
            colNum++;
          }
          foundBreak = true;
          break;
        }
      }
      if (b<lineStart) b = lineStart;
      if (!foundBreak) { /* no whitespace, just break at margin */
        newLineStart = max(p, buf->next_char(lineStart));
        colNum++;
	if (b >= buf->length()) { // STR #2730
	  width = 0;
	} else {
	  const char *s = buf->address(b);
	  width = measure_proportional_character(s, 0, p+styleBufOffset);
	}
      }
      if (p >= maxPos) {
        *retPos = maxPos;
        *retLines = maxPos < newLineStart ? nLines : nLines + 1;
        *retLineStart = maxPos < newLineStart ? lineStart : newLineStart;
        *retLineEnd = maxPos;
        return;
      }
      nLines++;
      if (nLines >= maxLines) {
        *retPos = foundBreak ? buf->next_char(b) : max(p, buf->next_char(lineStart));
        *retLines = nLines;
        *retLineStart = lineStart;
        *retLineEnd = foundBreak ? b : p;
        return;
      }
      lineStart = newLineStart;
    }
  }

  /* reached end of buffer before reaching pos or line target */
  *retPos = buf->length();
  *retLines = nLines;
  if (countLastLineMissingNewLine && colNum > 0)
    *retLines = buf->next_char(*retLines);
  *retLineStart = lineStart;
  *retLineEnd = buf->length();
}